

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O3

Var Js::HelperMethodWrapper<Js::HelperMethodWrapper0(Js::ScriptContext*,void*)::__0>
              (ScriptContext *scriptContext,anon_class_8_1_426fe81e fn)

{
  bool bVar1;
  DebuggingFlags *this;
  Var pvVar2;
  AutoRegisterIgnoreExceptionWrapper local_28;
  AutoRegisterIgnoreExceptionWrapper autoWrapper;
  
  this = DebugManager::GetDebuggingFlags(scriptContext->threadContext->debugManager);
  bVar1 = DebuggingFlags::IsBuiltInWrapperPresent(this);
  if (bVar1) {
    pvVar2 = (Var)(*(code *)fn.origHelperAddr)();
    return pvVar2;
  }
  AutoRegisterIgnoreExceptionWrapper::AutoRegisterIgnoreExceptionWrapper
            (&local_28,scriptContext->threadContext);
  pvVar2 = (Var)(*(code *)fn.origHelperAddr)();
  AutoRegisterIgnoreExceptionWrapper::~AutoRegisterIgnoreExceptionWrapper(&local_28);
  return pvVar2;
}

Assistant:

Var HelperMethodWrapper(ScriptContext* scriptContext, Fn fn)
    {
        if (AutoRegisterIgnoreExceptionWrapper::IsRegistered(scriptContext->GetThreadContext()))
        {
            return fn();
        }
        else
        {
            AutoRegisterIgnoreExceptionWrapper autoWrapper(scriptContext->GetThreadContext());
            return HelperOrLibraryMethodWrapper<false>(scriptContext, fn);
        }
    }